

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtzone.cpp
# Opt level: O2

void __thiscall
icu_63::VTimeZone::writeZonePropsByDOW_LEQ_DOM
          (VTimeZone *this,VTZWriter *writer,UBool isDst,UnicodeString *zonename,int32_t fromOffset,
          int32_t toOffset,int32_t month,int32_t dayOfMonth,int32_t dayOfWeek,UDate startTime,
          UDate untilTime,UErrorCode *status)

{
  int weekInMonth;
  
  if (U_ZERO_ERROR < *status) {
    return;
  }
  weekInMonth = dayOfMonth / 7;
  if (dayOfMonth % 7 == 0) {
LAB_0021355f:
    writeZonePropsByDOW(this,writer,isDst,zonename,fromOffset,toOffset,month,weekInMonth,dayOfWeek,
                        startTime,untilTime,status);
  }
  else {
    if (month == 1) {
      if (dayOfMonth == 0x1d) {
        weekInMonth = -1;
        month = 1;
        goto LAB_0021355f;
      }
    }
    else if ((*(int *)(MONTHLENGTH + (long)month * 4) - dayOfMonth) % 7 == 0) {
      weekInMonth = (*(int *)(MONTHLENGTH + (long)month * 4) - dayOfMonth) / -7 + -1;
      goto LAB_0021355f;
    }
    writeZonePropsByDOW_GEQ_DOM
              (this,writer,isDst,zonename,fromOffset,toOffset,month,dayOfMonth + -6,dayOfWeek,
               startTime,untilTime,status);
  }
  return;
}

Assistant:

void
VTimeZone::writeZonePropsByDOW_LEQ_DOM(VTZWriter& writer, UBool isDst, const UnicodeString& zonename,
                                       int32_t fromOffset, int32_t toOffset,
                                       int32_t month, int32_t dayOfMonth, int32_t dayOfWeek,
                                       UDate startTime, UDate untilTime, UErrorCode& status) const {
    if (U_FAILURE(status)) {
        return;
    }
    // Check if this rule can be converted to DOW rule
    if (dayOfMonth%7 == 0) {
        // Can be represented by DOW rule
        writeZonePropsByDOW(writer, isDst, zonename, fromOffset, toOffset,
                month, dayOfMonth/7, dayOfWeek, startTime, untilTime, status);
    } else if (month != UCAL_FEBRUARY && (MONTHLENGTH[month] - dayOfMonth)%7 == 0){
        // Can be represented by DOW rule with negative week number
        writeZonePropsByDOW(writer, isDst, zonename, fromOffset, toOffset,
                month, -1*((MONTHLENGTH[month] - dayOfMonth)/7 + 1), dayOfWeek, startTime, untilTime, status);
    } else if (month == UCAL_FEBRUARY && dayOfMonth == 29) {
        // Specical case for February
        writeZonePropsByDOW(writer, isDst, zonename, fromOffset, toOffset,
                UCAL_FEBRUARY, -1, dayOfWeek, startTime, untilTime, status);
    } else {
        // Otherwise, convert this to DOW_GEQ_DOM rule
        writeZonePropsByDOW_GEQ_DOM(writer, isDst, zonename, fromOffset, toOffset,
                month, dayOfMonth - 6, dayOfWeek, startTime, untilTime, status);
    }
}